

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtree.hpp
# Opt level: O3

void __thiscall
perior::
rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
::condense_node(rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
                *this,size_t N)

{
  pointer prVar1;
  ulong uVar2;
  pointer prVar3;
  pointer bg;
  pointer bg_1;
  long lVar4;
  size_t *psVar5;
  iterator found;
  temporal_vec_type eliminated_nodes;
  undefined1 local_78 [32];
  unsigned_long local_58 [2];
  stored_size_type local_48;
  size_t local_40 [2];
  long local_30;
  
  local_78._16_8_ = N;
  if ((this->tree_).m_holder.m_size <= N) {
    boost::container::throw_out_of_range("vector::at out of range");
  }
  prVar1 = (this->tree_).m_holder.m_start;
  if (prVar1[N].is_leaf != false) {
    __assert_fail("node.is_leaf == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ToruNiina[P]periortree/periortree/rtree.hpp"
                  ,0x175,
                  "void perior::rtree<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>, perior::quadratic<6, 2>, perior::cubic_periodic_boundary<perior::point<double, 2>>>::condense_node(const std::size_t) [T = std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>, Params = perior::quadratic<6, 2>, Boundary = perior::cubic_periodic_boundary<perior::point<double, 2>>, IndexableGetter = perior::indexable_getter<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>>, EqualTo = std::equal_to<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>>, Allocator = std::allocator<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>>]"
                 );
  }
  local_78._0_8_ = &prVar1[N].entry;
  uVar2 = prVar1[N].entry.
          super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
          .m_holder.m_size;
  if (uVar2 < 2) {
    if ((uVar2 != 1) || (prVar1[N].parent != 0xffffffffffffffff)) {
      local_58[1] = 0;
      local_48 = 2;
      local_78._24_8_ =
           (long)&(((container_type *)local_78._0_8_)->
                  super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
                  ).m_holder.super_static_storage_allocator<unsigned_long,_6UL,_0UL,_true>.storage +
           uVar2 * 8;
      local_58[0] = (unsigned_long)local_40;
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<boost::container::vec_iterator<unsigned_long*,true>,std::back_insert_iterator<boost::container::small_vector<unsigned_long,2ul,std::allocator<unsigned_long>,void>>>
                ((vec_iterator<unsigned_long_*,_true> *)local_78,
                 (vec_iterator<unsigned_long_*,_true> *)(local_78 + 0x18),
                 (small_vector<unsigned_long,_2UL,_std::allocator<unsigned_long>,_void> *)local_58);
      uVar2 = prVar1[N].parent;
      if (uVar2 < (this->tree_).m_holder.m_size) {
        prVar3 = (this->tree_).m_holder.m_start;
        local_78._0_8_ = &prVar3[uVar2].entry;
        local_78._24_8_ =
             prVar3[uVar2].box.center.values_.elems +
             prVar3[uVar2].entry.
             super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
             .m_holder.m_size + 0xfffffffffffffff9;
        std::
        __find_if<boost::container::vec_iterator<unsigned_long*,false>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                  (local_78 + 8,local_78,local_78 + 0x18,local_78 + 0x10);
        uVar2 = prVar1[N].parent;
        if ((this->tree_).m_holder.m_size <= uVar2) {
          boost::container::throw_out_of_range("vector::at out of range");
        }
        prVar3 = (this->tree_).m_holder.m_start;
        if ((double *)local_78._8_8_ ==
            prVar3[uVar2].box.center.values_.elems +
            prVar3[uVar2].entry.
            super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
            .m_holder.m_size + 0xfffffffffffffff9) {
          __assert_fail("found != this->tree_.at(node.parent).entry.end()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/ToruNiina[P]periortree/periortree/rtree.hpp"
                        ,0x18c,
                        "void perior::rtree<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>, perior::quadratic<6, 2>, perior::cubic_periodic_boundary<perior::point<double, 2>>>::condense_node(const std::size_t) [T = std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>, Params = perior::quadratic<6, 2>, Boundary = perior::cubic_periodic_boundary<perior::point<double, 2>>, IndexableGetter = perior::indexable_getter<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>>, EqualTo = std::equal_to<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>>, Allocator = std::allocator<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>>]"
                       );
        }
        local_30 = local_78._8_8_;
        boost::container::
        vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
        ::erase((vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
                 *)local_78,(const_iterator *)&prVar3[uVar2].entry);
        if (prVar1[N].parent < (this->tree_).m_holder.m_size) {
          condense_box(this,(this->tree_).m_holder.m_start + prVar1[N].parent);
          if (local_58[1] != 0) {
            lVar4 = local_58[1] << 3;
            psVar5 = (size_t *)local_58[0];
            do {
              if (psVar5 == (size_t *)0x0) {
                __assert_fail("!!m_ptr","/usr/include/boost/container/vector.hpp",0x8e,
                              "reference boost::container::vec_iterator<unsigned long *, true>::operator*() const [Pointer = unsigned long *, IsConst = true]"
                             );
              }
              re_insert(this,*psVar5);
              psVar5 = psVar5 + 1;
              lVar4 = lVar4 + -8;
            } while (lVar4 != 0);
          }
          condense_node(this,prVar1[N].parent);
          if (local_48 == 0) {
            return;
          }
          if (local_40 == (size_t *)local_58[0]) {
            return;
          }
          operator_delete((void *)local_58[0]);
          return;
        }
      }
      boost::container::throw_out_of_range("vector::at out of range");
    }
    this->root_ = *(size_t *)
                   &(((container_type *)local_78._0_8_)->
                    super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
                    ).m_holder.super_static_storage_allocator<unsigned_long,_6UL,_0UL,_true>.storage
    ;
    local_58[0] = N;
    boost::container::
    vector<unsigned_long,boost::container::small_vector_allocator<unsigned_long,std::allocator<void>,void>,void>
    ::priv_push_back<unsigned_long_const&>
              ((vector<unsigned_long,boost::container::small_vector_allocator<unsigned_long,std::allocator<void>,void>,void>
                *)&this->overwritable_nodes_,local_58);
  }
  return;
}

Assistant:

void condense_node(const std::size_t N)
    {
        const node_type& node = this->tree_.at(N);
        assert(node.is_leaf == false);

        if(node.has_enough_entry())
        {
            return;
        }
        if(node.parent == nil && node.entry.size() == 1)
        {
            this->root_ = node.entry.front();
            this->erase_node(N);
            return;
        }

        // collect index of nodes that are children of the node to be removed
        typedef typename gen_small_vector<std::size_t, min_entry>::type temporal_vec_type;
        temporal_vec_type eliminated_nodes;
        std::copy(node.entry.begin(), node.entry.end(),
                  std::back_inserter(eliminated_nodes));

        // erase the node N from its parent and condense its aabb
        typename node_type::iterator found = std::find(
                this->tree_.at(node.parent).entry.begin(),
                this->tree_.at(node.parent).entry.end(), N);
        assert(found != this->tree_.at(node.parent).entry.end());
        this->tree_.at(node.parent).entry.erase(found);
        this->condense_box(this->tree_.at(node.parent));

        // re-insert nodes eliminated from node N
        for(typename temporal_vec_type::const_iterator
                i(eliminated_nodes.begin()), e(eliminated_nodes.end()); i!=e; ++i)
        {
            this->re_insert(*i);
        }
        this->condense_node(node.parent);
        return;
    }